

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O3

int32_t __thiscall
icu_63::CollationBuilder::findOrInsertNodeForCEs
          (CollationBuilder *this,int32_t strength,char **parserErrorReason,UErrorCode *errorCode)

{
  int32_t iVar1;
  ulong ce;
  int iVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  iVar4 = this->cesLength;
  lVar3 = (long)iVar4;
  do {
    if (lVar3 == 0) {
      this->ces[0] = 0;
      this->cesLength = 1;
      ce = 0;
LAB_002259b9:
      iVar1 = findOrInsertNodeForRootCE(this,ce,strength,errorCode);
      return iVar1;
    }
    iVar4 = iVar4 + -1;
    ce = this->ces[lVar3 + -1];
    uVar5 = (int)ce + 0xba000000;
    if (uVar5 < 0xc0000000) {
      iVar2 = 0;
      if (((ce >> 0x38 == 0) && (iVar2 = 1, (char)(ce >> 0x18) == '\0')) && (iVar2 = 2, ce == 0)) {
        iVar2 = 0xf;
      }
      if (iVar2 <= strength) {
        if (0xbfffffff < uVar5) {
LAB_002259f0:
          uVar5 = (uint)(ce + 0xbfbffffff9ffe000 >> 0x20);
          return (uint)(ce + 0xbfbffffff9ffe000 >> 0x18) & 0x3f |
                 uVar5 >> 10 & 0x1fc0 | uVar5 >> 0xb & 0xfe000;
        }
        if ((char)(ce >> 0x38) == -2) {
          *errorCode = U_UNSUPPORTED_ERROR;
          *parserErrorReason = "tailoring relative to an unassigned code point not supported";
          return 0;
        }
        goto LAB_002259b9;
      }
    }
    else if ((int)((uint)(ce >> 8) & 3) <= strength) goto LAB_002259f0;
    lVar3 = lVar3 + -1;
    this->cesLength = iVar4;
  } while( true );
}

Assistant:

int32_t
CollationBuilder::findOrInsertNodeForCEs(int32_t strength, const char *&parserErrorReason,
                                         UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    U_ASSERT(UCOL_PRIMARY <= strength && strength <= UCOL_QUATERNARY);

    // Find the last CE that is at least as "strong" as the requested difference.
    // Note: Stronger is smaller (UCOL_PRIMARY=0).
    int64_t ce;
    for(;; --cesLength) {
        if(cesLength == 0) {
            ce = ces[0] = 0;
            cesLength = 1;
            break;
        } else {
            ce = ces[cesLength - 1];
        }
        if(ceStrength(ce) <= strength) { break; }
    }

    if(isTempCE(ce)) {
        // No need to findCommonNode() here for lower levels
        // because insertTailoredNodeAfter() will do that anyway.
        return indexFromTempCE(ce);
    }

    // root CE
    if((uint8_t)(ce >> 56) == Collation::UNASSIGNED_IMPLICIT_BYTE) {
        errorCode = U_UNSUPPORTED_ERROR;
        parserErrorReason = "tailoring relative to an unassigned code point not supported";
        return 0;
    }
    return findOrInsertNodeForRootCE(ce, strength, errorCode);
}